

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_dsa_asn1.cc
# Opt level: O0

int dsa_pub_encode(CBB *out,EVP_PKEY *key)

{
  DSA *dsa_00;
  int iVar1;
  bool bVar2;
  undefined1 local_c0 [8];
  CBB key_bitstring;
  CBB algorithm;
  CBB spki;
  int has_params;
  DSA *dsa;
  EVP_PKEY *key_local;
  CBB *out_local;
  
  dsa_00 = (DSA *)key->pkey;
  bVar2 = false;
  if ((dsa_00->p != (BIGNUM *)0x0) && (bVar2 = false, dsa_00->q != (BIGNUM *)0x0)) {
    bVar2 = dsa_00->g != (BIGNUM *)0x0;
  }
  iVar1 = CBB_add_asn1(out,(CBB *)((long)&algorithm.u + 0x18),0x20000010);
  if ((((((iVar1 != 0) &&
         (iVar1 = CBB_add_asn1((CBB *)((long)&algorithm.u + 0x18),
                               (CBB *)((long)&key_bitstring.u + 0x18),0x20000010), iVar1 != 0)) &&
        (iVar1 = CBB_add_asn1_element((CBB *)((long)&key_bitstring.u + 0x18),6,dsa_asn1_meth.oid,7),
        iVar1 != 0)) &&
       ((!bVar2 ||
        (iVar1 = DSA_marshal_parameters((CBB *)((long)&key_bitstring.u + 0x18),dsa_00), iVar1 != 0))
       )) && ((iVar1 = CBB_add_asn1((CBB *)((long)&algorithm.u + 0x18),(CBB *)local_c0,3),
              iVar1 != 0 &&
              ((iVar1 = CBB_add_u8((CBB *)local_c0,'\0'), iVar1 != 0 &&
               (iVar1 = BN_marshal_asn1((CBB *)local_c0,dsa_00->pub_key), iVar1 != 0)))))) &&
     (iVar1 = CBB_flush(out), iVar1 != 0)) {
    return 1;
  }
  ERR_put_error(6,0,0x69,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_dsa_asn1.cc"
                ,0x4a);
  return 0;
}

Assistant:

static int dsa_pub_encode(CBB *out, const EVP_PKEY *key) {
  const DSA *dsa = reinterpret_cast<const DSA *>(key->pkey);
  const int has_params =
      dsa->p != nullptr && dsa->q != nullptr && dsa->g != nullptr;

  // See RFC 5480, section 2.
  CBB spki, algorithm, key_bitstring;
  if (!CBB_add_asn1(out, &spki, CBS_ASN1_SEQUENCE) ||
      !CBB_add_asn1(&spki, &algorithm, CBS_ASN1_SEQUENCE) ||
      !CBB_add_asn1_element(&algorithm, CBS_ASN1_OBJECT, dsa_asn1_meth.oid,
                            dsa_asn1_meth.oid_len) ||
      (has_params && !DSA_marshal_parameters(&algorithm, dsa)) ||
      !CBB_add_asn1(&spki, &key_bitstring, CBS_ASN1_BITSTRING) ||
      !CBB_add_u8(&key_bitstring, 0 /* padding */) ||
      !BN_marshal_asn1(&key_bitstring, dsa->pub_key) || !CBB_flush(out)) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_ENCODE_ERROR);
    return 0;
  }

  return 1;
}